

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestMultiProcessHandler.cxx
# Opt level: O3

bool __thiscall cmCTestMultiProcessHandler::CheckStopTimePassed(cmCTestMultiProcessHandler *this)

{
  time_point tVar1;
  long lVar2;
  
  if (this->StopTimePassed == false) {
    tVar1 = cmCTest::GetStopTime(this->CTest);
    if (tVar1.__d.__r != 0) {
      lVar2 = std::chrono::_V2::system_clock::now();
      if ((long)tVar1.__d.__r <= lVar2) {
        SetStopTimePassed(this);
      }
    }
  }
  return this->StopTimePassed;
}

Assistant:

bool cmCTestMultiProcessHandler::CheckStopTimePassed()
{
  if (!this->StopTimePassed) {
    std::chrono::system_clock::time_point stop_time =
      this->CTest->GetStopTime();
    if (stop_time != std::chrono::system_clock::time_point() &&
        stop_time <= std::chrono::system_clock::now()) {
      this->SetStopTimePassed();
    }
  }
  return this->StopTimePassed;
}